

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_after_colon.cpp
# Opt level: O1

int main(void)

{
  size_type __pos;
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  long *plVar4;
  string str;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Hello World","");
  plVar1 = (long *)((long)local_30 + local_28);
  lVar3 = local_28 >> 2;
  plVar4 = plVar1;
  if (0 < lVar3) {
    plVar4 = (long *)((long)plVar1 + lVar3 * -4);
    lVar3 = lVar3 + 1;
    do {
      if (*(char *)((long)plVar1 + -1) == ':') goto LAB_001012c0;
      if (*(char *)((long)plVar1 + -2) == ':') {
        plVar1 = (long *)((long)plVar1 + -1);
        goto LAB_001012c0;
      }
      if (*(char *)((long)plVar1 + -3) == ':') {
        plVar1 = (long *)((long)plVar1 + -2);
        goto LAB_001012c0;
      }
      if (*(char *)((long)plVar1 + -4) == ':') {
        plVar1 = (long *)((long)plVar1 + -3);
        goto LAB_001012c0;
      }
      plVar1 = (long *)((long)plVar1 + -4);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)plVar4 - (long)local_30;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      plVar1 = local_30;
      if ((lVar3 != 3) || (plVar1 = plVar4, *(char *)((long)plVar4 + -1) == ':')) goto LAB_001012c0;
      plVar4 = (long *)((long)plVar4 + -1);
    }
    plVar1 = plVar4;
    if (*(char *)((long)plVar4 + -1) == ':') goto LAB_001012c0;
    plVar4 = (long *)((long)plVar4 + -1);
  }
  plVar1 = plVar4;
  if (*(char *)((long)plVar4 + -1) != ':') {
    plVar1 = local_30;
  }
LAB_001012c0:
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((long)plVar1 - (long)local_30 != 0) {
    *(undefined1 *)plVar1 = 0;
    local_28 = (long)plVar1 - (long)local_30;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
  string str = "Hello World";
  // Predicate
  auto isColon = [](int ch) { return ch == ':'; };
  // The last element satisfying the predicate or the first element if not found
  // Searching from the end backwards
  auto first = find_if(rbegin(str), rend(str), isColon);

  cout << str << "\n";

  // If found - delete everything after
  if (first != rend(str))
    str.erase(first.base(), end(str));

  cout << str << "\n";
}